

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

int secp256k1_ec_privkey_tweak_mul(secp256k1_context *ctx,uchar *seckey,uchar *tweak)

{
  uint uVar1;
  long in_RDX;
  uchar *in_RSI;
  int overflow;
  int ret;
  secp256k1_scalar sec;
  secp256k1_scalar factor;
  secp256k1_scalar *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  bool bVar2;
  int iVar3;
  undefined4 uVar4;
  secp256k1_scalar *in_stack_ffffffffffffffa0;
  secp256k1_scalar local_40;
  uchar *local_18;
  uint local_4;
  
  uVar4 = 0;
  iVar3 = 0;
  if (in_RSI == (uchar *)0x0) {
    secp256k1_callback_call
              ((secp256k1_callback *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
               (char *)in_stack_ffffffffffffff88);
    local_4 = 0;
  }
  else if (in_RDX == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
               (char *)in_stack_ffffffffffffff88);
    local_4 = 0;
  }
  else {
    local_18 = in_RSI;
    secp256k1_scalar_set_b32
              (in_stack_ffffffffffffffa0,(uchar *)0x0,
               (int *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
    secp256k1_scalar_set_b32
              (in_stack_ffffffffffffffa0,(uchar *)CONCAT44(uVar4,iVar3),
               (int *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
    bVar2 = false;
    if (iVar3 == 0) {
      iVar3 = secp256k1_eckey_privkey_tweak_mul
                        (in_stack_ffffffffffffff88,(secp256k1_scalar *)0x106a18);
      bVar2 = iVar3 != 0;
    }
    uVar1 = (uint)bVar2;
    memset(local_18,0,0x20);
    if (uVar1 != 0) {
      secp256k1_scalar_get_b32(local_18,(secp256k1_scalar *)&stack0xffffffffffffffa0);
    }
    secp256k1_scalar_clear((secp256k1_scalar *)&stack0xffffffffffffffa0);
    secp256k1_scalar_clear(&local_40);
    local_4 = uVar1;
  }
  return local_4;
}

Assistant:

int secp256k1_ec_privkey_tweak_mul(const secp256k1_context* ctx, unsigned char *seckey, const unsigned char *tweak) {
    secp256k1_scalar factor;
    secp256k1_scalar sec;
    int ret = 0;
    int overflow = 0;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(seckey != NULL);
    ARG_CHECK(tweak != NULL);

    secp256k1_scalar_set_b32(&factor, tweak, &overflow);
    secp256k1_scalar_set_b32(&sec, seckey, NULL);
    ret = !overflow && secp256k1_eckey_privkey_tweak_mul(&sec, &factor);
    memset(seckey, 0, 32);
    if (ret) {
        secp256k1_scalar_get_b32(seckey, &sec);
    }

    secp256k1_scalar_clear(&sec);
    secp256k1_scalar_clear(&factor);
    return ret;
}